

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

void __thiscall
helics::apps::App::processArgs
          (App *this,
          unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *app,
          FederateInfo *fedInfo,string_view defaultAppName)

{
  ParseOutput PVar1;
  helicsCLI11App *phVar2;
  pointer ppVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *miss;
  pointer ppVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  undefined1 local_88 [32];
  char *local_68;
  size_t local_60;
  string local_58;
  
  local_68 = defaultAppName._M_str;
  local_60 = defaultAppName._M_len;
  phVar2 = (app->_M_t).
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl;
  local_88._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_88._16_8_ = (pointer)0x0;
  ppVar3 = *(pointer *)((long)&(phVar2->super_App).missing_ + 8);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_;
  for (ppVar7 = *(pointer *)
                 &(phVar2->super_App).missing_.
                  super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl; local_88._0_8_ = this_01, ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88,&ppVar7->second);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._0_8_;
  }
  __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (local_88._8_8_ + -0x20);
  if (this_01 < __s &&
      this_01 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._8_8_
     ) {
    do {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                (this_01,__s);
      this_01 = this_01 + 1;
      __s = __s + -1;
    } while (this_01 < __s);
  }
  local_58._M_dataplus._M_p =
       (pointer)(this->remArgs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_string_length =
       (size_type)
       (this->remArgs).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.field_2._M_allocated_capacity =
       (size_type)
       (this->remArgs).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
  (this->remArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_88);
  PVar1 = ((app->_M_t).
           super___uniq_ptr_impl<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>
           .super__Head_base<0UL,_helics::helicsCLI11App_*,_false>._M_head_impl)->last_output;
  if (PVar1 == OK) {
    if (((this->inputFileName)._M_string_length == 0) && (this->fileLoaded == false)) {
      local_88._0_8_ = (pointer)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"helics.json","");
      CLI::Validator::operator()(&local_58,(Validator *)CLI::ExistingFile,(string *)local_88);
      sVar6 = local_58._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        (ulong)(local_58.field_2._M_allocated_capacity + 1));
      }
      if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
      }
      if ((pointer)sVar6 == (pointer)0x0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace(&this->inputFileName,0,(this->inputFileName)._M_string_length,"helics.json",0xb);
      }
    }
    if ((fedInfo->defName)._M_string_length == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace(&fedInfo->defName,0,0,local_68,local_60);
    }
    local_58._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::CombinationFederate,std::allocator<helics::CombinationFederate>,char_const(&)[1],helics::FederateInfo&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length,
               (CombinationFederate **)&local_58,(allocator<helics::CombinationFederate> *)local_88,
               (char (*) [1])0x415f22,fedInfo);
    sVar6 = local_58._M_string_length;
    _Var5._M_p = local_58._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    this_00 = (this->fed).
              super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var5._M_p;
    (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar6;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
    }
    peVar4 = (this->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->configFileName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (&(peVar4->super_ValueFederate).field_0x38 +
               (long)(peVar4->super_ValueFederate)._vptr_ValueFederate[-3]));
  }
  else {
    if (PVar1 == HELP_CALL) {
      this->helpMode = true;
    }
    this->deactivated = true;
  }
  return;
}

Assistant:

void App::processArgs(std::unique_ptr<helicsCLI11App>& app,
                      FederateInfo& fedInfo,
                      std::string_view defaultAppName)
{
    remArgs = app->remaining_for_passthrough();
    auto ret = app->last_output;
    if (ret == helicsCLI11App::ParseOutput::HELP_CALL) {
        helpMode = true;
    }
    if (ret != helicsCLI11App::ParseOutput::OK) {
        deactivated = true;
        return;
    }

    if (inputFileName.empty()) {
        if (!fileLoaded) {
            if (CLI::ExistingFile("helics.json").empty()) {
                inputFileName = "helics.json";
            }
        }
    }

    if (fedInfo.defName.empty()) {
        fedInfo.defName = defaultAppName;
    }

    fed = std::make_shared<CombinationFederate>("", fedInfo);
    configFileName = fed->getConfigFile();
}